

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfonticonengine.cpp
# Opt level: O3

void __thiscall
QFontIconEngine::paint(QFontIconEngine *this,QPainter *painter,QRect *rect,Mode mode,State state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  _Head_base<0UL,_QBrushData_*,_false> _Var5;
  QColor color;
  uint uVar6;
  undefined4 extraout_EAX;
  QBrush *pQVar7;
  QFontEngine *pQVar8;
  ColorRole cr;
  ColorGroup gr;
  long in_FS_OFFSET;
  double dVar9;
  undefined8 uVar10;
  double dVar11;
  int iVar13;
  double dVar14;
  double __x;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar12 [16];
  QPainterPath path;
  glyph_t glyphIndex;
  int iVar15;
  undefined8 uVar16;
  undefined1 *puVar17;
  undefined8 uVar18;
  QPointF local_e8;
  QRectF local_d8;
  QPainterPath local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  uint local_8c;
  QString local_88;
  undefined1 local_68 [16];
  QColor local_58;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QPainter::save(painter);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QFont::QFont((QFont *)local_48,&this->m_iconFont);
  QFont::setPixelSize((QFont *)local_48,((rect->y2).m_i - (rect->y1).m_i) + 1);
  local_58._0_6_ = 0xaaaaaaaaaaaa;
  local_58.ct.argb.red = 0xaaaa;
  local_58.ct._4_6_ = 0xaaaaaaaaaaaa;
  local_58._14_2_ = 0xaaaa;
  QColor::QColor(&local_58,black);
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPalette::QPalette((QPalette *)local_68);
  switch(mode) {
  case Normal:
  case Active:
    gr = Active;
    break;
  case Disabled:
    gr = Disabled;
    break;
  case Selected:
    gr = Active;
    cr = HighlightedText;
    goto LAB_0026dbbb;
  default:
    goto switchD_0026db89_default;
  }
  cr = Text;
LAB_0026dbbb:
  pQVar7 = QPalette::brush((QPalette *)local_68,gr,cr);
  _Var5._M_head_impl =
       (pQVar7->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
  uVar18 = *(undefined8 *)&(_Var5._M_head_impl)->color;
  local_58.ct._4_6_ =
       (undefined6)
       ((ulong)*(undefined8 *)((long)&((_Var5._M_head_impl)->color).ct.argb + 2) >> 0x10);
  local_58._0_6_ = SUB86(uVar18,0);
  local_58.ct.argb.red = (ushort)((ulong)uVar18 >> 0x30);
switchD_0026db89_default:
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (*(this->super_QIconEngine)._vptr_QIconEngine[0x10])(&local_88,this);
  if ((undefined1 *)local_88.d.size == (undefined1 *)0x0) {
    uVar6 = (*(this->super_QIconEngine)._vptr_QIconEngine[0x11])(this);
    local_8c = uVar6;
    if (uVar6 != 0) {
      pQVar8 = QFontPrivate::engineForScript((QFontPrivate *)local_48._0_8_,2);
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
      (*pQVar8->_vptr_QFontEngine[0x1c])(&local_a8,pQVar8,(ulong)uVar6);
      dVar14 = (double)(int)((ulong)local_a8 >> 0x20) * 0.015625;
      puVar17 = local_a8;
      dVar9 = floor((double)(int)local_a8 * 0.015625);
      dVar14 = floor(dVar14);
      uVar10 = CONCAT44((int)dVar14,(int)dVar9);
      uVar16 = 0;
      dVar9 = (double)((int)puStack_a0 + (int)puVar17) * 0.015625;
      __x = (double)((int)((ulong)puStack_a0 >> 0x20) + (int)((ulong)puVar17 >> 0x20)) * 0.015625;
      dVar14 = ceil(dVar9);
      uVar18 = extraout_XMM0_Qb;
      dVar11 = ceil(__x);
      iVar15 = (int)((ulong)uVar10 >> 0x20);
      auVar12._0_4_ = -(uint)((int)uVar10 < (int)dVar14);
      iVar13 = -(uint)(iVar15 < (int)dVar11);
      auVar12._4_4_ = auVar12._0_4_;
      auVar12._8_4_ = iVar13;
      auVar12._12_4_ = iVar13;
      iVar13 = movmskpd(extraout_EAX,auVar12);
      if (iVar13 == 3) {
        local_b0 = CONCAT44(iVar15 * -0x40,(int)uVar10 * -0x40);
        local_b8.d_ptr.d.ptr =
             (QExplicitlySharedDataPointer<QPainterPathPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        QPainterPath::QPainterPath(&local_b8);
        QPainterPath::setFillRule(&local_b8,WindingFill);
        (*pQVar8->_vptr_QFontEngine[0xf])
                  (pQVar8,&local_8c,&local_b0,1,&local_b8,0,dVar9,__x,uVar10,uVar16,dVar14,uVar18);
        local_d8.w._0_4_ = 0xffffffff;
        local_d8.w._4_4_ = 0xffffffff;
        local_d8.h._0_4_ = 0xffffffff;
        local_d8.h._4_4_ = 0xffffffff;
        local_d8.xp._0_4_ = 0xffffffff;
        local_d8.xp._4_4_ = 0xffffffff;
        local_d8.yp._0_4_ = 0xffffffff;
        local_d8.yp._4_4_ = 0xffffffff;
        QPainterPath::boundingRect(&local_d8,&local_b8);
        uVar1 = rect->x1;
        uVar3 = rect->y1;
        uVar2 = rect->x2;
        uVar4 = rect->y2;
        local_e8.xp = ((double)((uVar2 - uVar1) + 1) -
                      (double)CONCAT44(local_d8.w._4_4_,local_d8.w._0_4_)) * 0.5 +
                      ((double)(int)uVar1 - (double)CONCAT44(local_d8.xp._4_4_,local_d8.xp._0_4_));
        local_e8.yp = ((double)((uVar4 - uVar3) + 1) -
                      (double)CONCAT44(local_d8.h._4_4_,local_d8.h._0_4_)) * 0.5 +
                      ((double)(int)uVar3 - (double)CONCAT44(local_d8.yp._4_4_,local_d8.yp._0_4_));
        QPainter::translate(painter,&local_e8);
        QPainter::setRenderHint(painter,Antialiasing,true);
        QPainter::setPen(painter,NoPen);
        color.ct.argb.red = local_58.ct.argb.red;
        color._0_6_ = local_58._0_6_;
        color.ct._4_6_ = local_58.ct._4_6_;
        color._14_2_ = local_58._14_2_;
        QPainter::setBrush(painter,color);
        QPainter::drawPath(painter,&local_b8);
        QPainterPath::~QPainterPath(&local_b8);
      }
    }
  }
  else {
    QPainter::setFont(painter,(QFont *)local_48);
    QPainter::setPen(painter,&local_58);
    QPainter::drawText(painter,rect,0x84,&local_88,(QRect *)0x0);
  }
  QPainter::restore(painter);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  QPalette::~QPalette((QPalette *)local_68);
  QFont::~QFont((QFont *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontIconEngine::paint(QPainter *painter, const QRect &rect, QIcon::Mode mode, QIcon::State state)
{
    Q_UNUSED(state);

    painter->save();
    QFont renderFont(m_iconFont);
    renderFont.setPixelSize(rect.height());

    QColor color = Qt::black;
    QPalette palette;
    switch (mode) {
    case QIcon::Active:
        color = palette.color(QPalette::Active, QPalette::Text);
        break;
    case QIcon::Normal:
        color = palette.color(QPalette::Active, QPalette::Text);
        break;
    case QIcon::Disabled:
        color = palette.color(QPalette::Disabled, QPalette::Text);
        break;
    case QIcon::Selected:
        color = palette.color(QPalette::Active, QPalette::HighlightedText);
        break;
    }

    const QString text = string();
    if (!text.isEmpty()) {
        painter->setFont(renderFont);
        painter->setPen(color);
        painter->drawText(rect, Qt::AlignCenter, text);
    } else if (glyph_t glyphIndex = glyph()) {
        QFontEngine *engine = QFontPrivate::get(renderFont)->engineForScript(QChar::Script_Common);

        const glyph_metrics_t gm = engine->boundingBox(glyphIndex);
        const int glyph_x = qFloor(gm.x.toReal());
        const int glyph_y = qFloor(gm.y.toReal());
        const int glyph_width = qCeil((gm.x + gm.width).toReal()) - glyph_x;
        const int glyph_height = qCeil((gm.y + gm.height).toReal()) - glyph_y;

        if (glyph_width > 0 && glyph_height > 0) {
            QFixedPoint pt(QFixed(-glyph_x), QFixed(-glyph_y));
            QPainterPath path;
            path.setFillRule(Qt::WindingFill);
            engine->addGlyphsToPath(&glyphIndex, &pt, 1, &path, {});
            // make the glyph fit tightly into rect
            const QRectF pathBoundingRect = path.boundingRect();
            // center the glyph inside the rect
            const QPointF topLeft = rect.topLeft() - pathBoundingRect.topLeft()
                            + (QPointF(rect.width(), rect.height())
                                - QPointF(pathBoundingRect.width(), pathBoundingRect.height())) / 2;
            painter->translate(topLeft);

            painter->setRenderHint(QPainter::Antialiasing);
            painter->setPen(Qt::NoPen);
            painter->setBrush(color);
            painter->drawPath(path);
        }
    }
    painter->restore();
}